

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>,true>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  local_28.v128_.v = (v128)Pop(this);
  lVar1 = 0;
  do {
    *(ushort *)((long)&local_38 + lVar1 * 2) =
         (ushort)*(byte *)((long)&local_18 + lVar1) * (ushort)*(byte *)((long)&local_28 + lVar1);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}